

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O1

FT_Pointer
ft_mem_qrealloc(FT_Memory memory,FT_Long item_size,FT_Long cur_count,FT_Long new_count,void *block,
               FT_Error *p_error)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  int iVar3;
  bool bVar4;
  
  if ((cur_count | item_size | new_count) < 0) {
    iVar3 = 6;
  }
  else if (item_size == 0 || new_count == 0) {
    if (block != (void *)0x0) {
      (*memory->free)(memory,block);
    }
    iVar3 = 0;
    block = (void *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = item_size;
    iVar3 = 10;
    if (new_count <= SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar1,0)) {
      if (cur_count == 0) {
        block = (*memory->alloc)(memory,new_count * item_size);
        bVar4 = block == (void *)0x0;
      }
      else {
        pvVar2 = (*memory->realloc)(memory,cur_count * item_size,new_count * item_size,block);
        bVar4 = pvVar2 == (void *)0x0;
        if (!bVar4) {
          block = pvVar2;
        }
      }
      iVar3 = (uint)bVar4 << 6;
    }
  }
  *p_error = iVar3;
  return block;
}

Assistant:

FT_BASE_DEF( FT_Pointer )
  ft_mem_qrealloc( FT_Memory  memory,
                   FT_Long    item_size,
                   FT_Long    cur_count,
                   FT_Long    new_count,
                   void*      block,
                   FT_Error  *p_error )
  {
    FT_Error  error = FT_Err_Ok;


    /* Note that we now accept `item_size == 0' as a valid parameter, in
     * order to cover very weird cases where an ALLOC_MULT macro would be
     * called.
     */
    if ( cur_count < 0 || new_count < 0 || item_size < 0 )
    {
      /* may help catch/prevent nasty security issues */
      error = FT_THROW( Invalid_Argument );
    }
    else if ( new_count == 0 || item_size == 0 )
    {
      ft_mem_free( memory, block );
      block = NULL;
    }
    else if ( new_count > FT_INT_MAX / item_size )
    {
      error = FT_THROW( Array_Too_Large );
    }
    else if ( cur_count == 0 )
    {
      FT_ASSERT( !block );

      block = memory->alloc( memory, new_count * item_size );
      if ( block == NULL )
        error = FT_THROW( Out_Of_Memory );
    }
    else
    {
      FT_Pointer  block2;
      FT_Long     cur_size = cur_count * item_size;
      FT_Long     new_size = new_count * item_size;


      block2 = memory->realloc( memory, cur_size, new_size, block );
      if ( !block2 )
        error = FT_THROW( Out_Of_Memory );
      else
        block = block2;
    }

    *p_error = error;
    return block;
  }